

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool __thiscall
implementations::scheme::SchemeFrame::resolveExpression(SchemeFrame *this,cell *value)

{
  value_type *__x;
  cell_type cVar1;
  pointer pcVar2;
  bool bVar3;
  cells *this_00;
  pointer __x_00;
  string first;
  allocator_type local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cell local_88;
  
  cVar1 = value->type;
  if (cVar1 != List) {
    if ((cVar1 != Number) && (cVar1 == Symbol)) {
      value = lookup(this,&value->val);
    }
LAB_0012353b:
    cell::operator=(&(this->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,value);
    return true;
  }
  pcVar2 = (value->list).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar2 == (value->list).
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0012353b;
  std::__cxx11::string::string((string *)&local_a8,(string *)&pcVar2->val);
  pcVar2 = (value->list).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->arguments;
  local_88.type = Symbol;
  local_88._4_4_ = 0;
  local_88.val._M_dataplus._M_p = (pointer)0x0;
  local_88.val._M_string_length = 0;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  _M_move_assign(this_00,&local_88);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *)
          &local_88);
  cell::operator=(&this->exp,
                  (value->list).
                  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  if ((this->exp).type == Symbol) {
    bVar3 = std::operator==(&local_a8,"quote");
    if (bVar3) {
      bVar3 = true;
      cell::operator=(&(this->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result,
                      (value->list).
                      super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
      goto LAB_00123641;
    }
    __x = pcVar2 + 1;
    bVar3 = std::operator==(&local_a8,"if");
    if (bVar3) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(this_00,__x);
      this_00 = &this->resolved_arguments;
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(this_00,pcVar2 + 2);
      __x_00 = (pointer)nil;
      if (pcVar2 + 3 !=
          (value->list).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __x_00 = pcVar2 + 3;
      }
    }
    else {
      bVar3 = std::operator==(&local_a8,"set!");
      if (bVar3) {
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,__x);
      }
      else {
        bVar3 = std::operator==(&local_a8,"define");
        if (!bVar3) {
          bVar3 = std::operator==(&local_a8,"lambda");
          if (bVar3) {
            cell::cell(&local_88,value);
            cell::operator=(&(this->
                             super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                             ).result,&local_88);
            cell::~cell(&local_88);
            (this->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            ).result.type = Lambda;
            std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::
            operator=(&(this->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result.env.
                       super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                      ,&(this->
                        super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                        ).env.
                        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                     );
            bVar3 = true;
            goto LAB_00123641;
          }
          bVar3 = std::operator==(&local_a8,"begin");
          if (!bVar3) goto LAB_001234fd;
          std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
          vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
                    ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                      *)&local_88,
                     (value->list).
                     super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     (value->list).
                     super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_a9);
          std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::_M_move_assign(&this->resolved_arguments,&local_88);
          goto LAB_00123527;
        }
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,__x);
      }
      __x_00 = pcVar2 + 2;
    }
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    push_back(this_00,__x_00);
  }
  else {
LAB_001234fd:
    std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
    vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
              ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                *)&local_88,
               (value->list).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (value->list).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_a9);
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    _M_move_assign(this_00,&local_88);
LAB_00123527:
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&local_88);
  }
  bVar3 = false;
LAB_00123641:
  std::__cxx11::string::~string((string *)&local_a8);
  return bVar3;
}

Assistant:

bool resolveExpression(cell &value) {
		switch (value.type) {
		case Symbol:
			result = lookup(value.val);
			return true;
		case Number:
			result = value;
			return true;
		case List:
		{
			if (value.list.empty()) {
				result = value;
				return true;
			}
			auto first = value.list[0].val;
			// iterator skips first item
			cells::iterator it = value.list.begin() + 1;
			arguments = cells();
			exp = value.list[0];
			if (exp.type == Symbol) {
				if (first == "quote") {         // (quote exp)
					result = value.list[1];
					return true;
				} else if (first == "if") {     // (if test conseq [alt])
					// becomes (if conseq alt test)
					// test
					arguments.push_back(*it); ++it;
					// conseq
					resolved_arguments.push_back(*it); ++it;
					// [alt]
					if (it != value.list.cend())
						resolved_arguments.push_back(*it);
					else
						resolved_arguments.push_back(nil);
					return false;
				} else if (first == "set!") {   // (set! var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "define") { // (define var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					// exp
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "lambda") { // (lambda (var*) exp)
					result = cell(value);
					result.type = Lambda;
					result.env = env;
					return true;
				} else if (first == "begin") {  // (begin exp*)
					resolved_arguments = cells(value.list.cbegin() + 1, value.list.cend());
					return false;
				}
			}
			// (proc exp*)
			arguments = cells(value.list.cbegin(), value.list.cend());
			return false;
		}
		default:
			// Other sort of value
			result = value;
			return true;
		}
	}